

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Unproject(Vector3 source,Matrix projection,Matrix view)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  Vector3 VVar32;
  undefined4 local_18;
  undefined4 uStack_14;
  
  fVar6 = source.z;
  fVar12 = view.m3 * projection.m12 +
           view.m2 * projection.m8 + view.m0 * projection.m0 + view.m1 * projection.m4;
  fVar13 = view.m3 * projection.m13 +
           view.m2 * projection.m9 + view.m0 * projection.m1 + view.m1 * projection.m5;
  fVar1 = view.m3 * projection.m14 +
          view.m2 * projection.m10 + view.m0 * projection.m2 + view.m1 * projection.m6;
  fVar7 = view.m3 * projection.m15 +
          view.m2 * projection.m11 + view.m0 * projection.m3 + view.m1 * projection.m7;
  fVar14 = view.m7 * projection.m12 +
           view.m6 * projection.m8 + view.m4 * projection.m0 + projection.m4 * view.m5;
  fVar17 = view.m7 * projection.m13 +
           view.m6 * projection.m9 + view.m4 * projection.m1 + projection.m5 * view.m5;
  fVar18 = view.m7 * projection.m14 +
           view.m6 * projection.m10 + view.m4 * projection.m2 + projection.m6 * view.m5;
  fVar28 = view.m7 * projection.m15 +
           view.m6 * projection.m11 + view.m4 * projection.m3 + view.m5 * projection.m7;
  fVar8 = view.m11 * projection.m12 +
          view.m10 * projection.m8 + view.m8 * projection.m0 + projection.m4 * view.m9;
  fVar9 = view.m11 * projection.m13 +
          view.m10 * projection.m9 + view.m8 * projection.m1 + projection.m5 * view.m9;
  fVar10 = view.m11 * projection.m14 +
           view.m10 * projection.m10 + view.m8 * projection.m2 + projection.m6 * view.m9;
  fVar29 = view.m11 * projection.m15 +
           view.m10 * projection.m11 + view.m8 * projection.m3 + view.m9 * projection.m7;
  fVar2 = projection.m12 * view.m15 +
          projection.m8 * view.m14 + projection.m0 * view.m12 + projection.m4 * view.m13;
  fVar3 = projection.m13 * view.m15 +
          projection.m9 * view.m14 + projection.m1 * view.m12 + projection.m5 * view.m13;
  fVar23 = projection.m14 * view.m15 +
           projection.m10 * view.m14 + projection.m2 * view.m12 + projection.m6 * view.m13;
  fVar25 = view.m15 * projection.m15 +
           view.m14 * projection.m11 + view.m12 * projection.m3 + projection.m7 * view.m13;
  fVar15 = fVar12 * fVar17 - fVar13 * fVar14;
  fVar11 = fVar12 * fVar3 - fVar13 * fVar2;
  fVar26 = fVar14 * fVar9 - fVar17 * fVar8;
  fVar22 = fVar14 * fVar3 - fVar17 * fVar2;
  fVar30 = fVar1 * fVar29 - fVar7 * fVar10;
  fVar19 = fVar1 * fVar25 - fVar7 * fVar23;
  fVar31 = fVar18 * fVar29 - fVar28 * fVar10;
  fVar16 = fVar18 * fVar25 - fVar28 * fVar23;
  fVar27 = fVar10 * fVar25 - fVar29 * fVar23;
  fVar24 = fVar12 * fVar9 - fVar13 * fVar8;
  fVar21 = fVar8 * fVar3 - fVar9 * fVar2;
  fVar20 = fVar1 * fVar28 - fVar7 * fVar18;
  fVar4 = 1.0 / (fVar21 * fVar20 +
                ((fVar26 * fVar19 + fVar11 * fVar31 + (fVar15 * fVar27 - fVar16 * fVar24)) -
                fVar22 * fVar30));
  local_18 = source.x;
  uStack_14 = source.y;
  fVar5 = ((fVar28 * fVar24 - fVar7 * fVar26) - fVar29 * fVar15) * fVar4 * fVar6 +
          ((fVar17 * fVar30 - fVar13 * fVar31) - fVar9 * fVar20) * fVar4 * local_18 +
          uStack_14 * (fVar20 * fVar8 + (fVar31 * fVar12 - fVar30 * fVar14)) * fVar4 +
          (fVar15 * fVar10 + (fVar26 * fVar1 - fVar24 * fVar18)) * fVar4;
  VVar32.y = (((fVar29 * fVar11 - fVar7 * fVar21) - fVar25 * fVar24) * fVar4 * fVar6 +
              ((fVar9 * fVar19 - fVar13 * fVar27) - fVar3 * fVar30) * fVar4 * local_18 +
              (fVar2 * fVar30 + (fVar27 * fVar12 - fVar19 * fVar8)) * fVar4 * uStack_14 +
             (fVar23 * fVar24 + (fVar21 * fVar1 - fVar11 * fVar10)) * fVar4) / fVar5;
  VVar32.x = ((fVar25 * fVar26 + (fVar28 * fVar21 - fVar22 * fVar29)) * fVar4 * fVar6 +
              (fVar3 * fVar31 + (fVar17 * fVar27 - fVar16 * fVar9)) * fVar4 * local_18 +
              ((fVar8 * fVar16 - fVar14 * fVar27) - fVar2 * fVar31) * fVar4 * uStack_14 +
             ((fVar10 * fVar22 - fVar18 * fVar21) - fVar23 * fVar26) * fVar4) / fVar5;
  VVar32.z = ((fVar25 * fVar15 + (fVar7 * fVar22 - fVar11 * fVar28)) * fVar4 * fVar6 +
              (fVar3 * fVar20 + (fVar13 * fVar16 - fVar19 * fVar17)) * fVar4 * local_18 +
              ((fVar14 * fVar19 - fVar16 * fVar12) - fVar2 * fVar20) * fVar4 * uStack_14 +
             ((fVar18 * fVar11 - fVar22 * fVar1) - fVar23 * fVar15) * fVar4) / fVar5;
  return VVar32;
}

Assistant:

RMAPI Vector3 Vector3Unproject(Vector3 source, Matrix projection, Matrix view)
{
    Vector3 result = { 0 };

    // Calculate unprojected matrix (multiply view matrix by projection matrix) and invert it
    Matrix matViewProj = {      // MatrixMultiply(view, projection);
        view.m0*projection.m0 + view.m1*projection.m4 + view.m2*projection.m8 + view.m3*projection.m12,
        view.m0*projection.m1 + view.m1*projection.m5 + view.m2*projection.m9 + view.m3*projection.m13,
        view.m0*projection.m2 + view.m1*projection.m6 + view.m2*projection.m10 + view.m3*projection.m14,
        view.m0*projection.m3 + view.m1*projection.m7 + view.m2*projection.m11 + view.m3*projection.m15,
        view.m4*projection.m0 + view.m5*projection.m4 + view.m6*projection.m8 + view.m7*projection.m12,
        view.m4*projection.m1 + view.m5*projection.m5 + view.m6*projection.m9 + view.m7*projection.m13,
        view.m4*projection.m2 + view.m5*projection.m6 + view.m6*projection.m10 + view.m7*projection.m14,
        view.m4*projection.m3 + view.m5*projection.m7 + view.m6*projection.m11 + view.m7*projection.m15,
        view.m8*projection.m0 + view.m9*projection.m4 + view.m10*projection.m8 + view.m11*projection.m12,
        view.m8*projection.m1 + view.m9*projection.m5 + view.m10*projection.m9 + view.m11*projection.m13,
        view.m8*projection.m2 + view.m9*projection.m6 + view.m10*projection.m10 + view.m11*projection.m14,
        view.m8*projection.m3 + view.m9*projection.m7 + view.m10*projection.m11 + view.m11*projection.m15,
        view.m12*projection.m0 + view.m13*projection.m4 + view.m14*projection.m8 + view.m15*projection.m12,
        view.m12*projection.m1 + view.m13*projection.m5 + view.m14*projection.m9 + view.m15*projection.m13,
        view.m12*projection.m2 + view.m13*projection.m6 + view.m14*projection.m10 + view.m15*projection.m14,
        view.m12*projection.m3 + view.m13*projection.m7 + view.m14*projection.m11 + view.m15*projection.m15 };

    // Calculate inverted matrix -> MatrixInvert(matViewProj);
    // Cache the matrix values (speed optimization)
    float a00 = matViewProj.m0, a01 = matViewProj.m1, a02 = matViewProj.m2, a03 = matViewProj.m3;
    float a10 = matViewProj.m4, a11 = matViewProj.m5, a12 = matViewProj.m6, a13 = matViewProj.m7;
    float a20 = matViewProj.m8, a21 = matViewProj.m9, a22 = matViewProj.m10, a23 = matViewProj.m11;
    float a30 = matViewProj.m12, a31 = matViewProj.m13, a32 = matViewProj.m14, a33 = matViewProj.m15;

    float b00 = a00*a11 - a01*a10;
    float b01 = a00*a12 - a02*a10;
    float b02 = a00*a13 - a03*a10;
    float b03 = a01*a12 - a02*a11;
    float b04 = a01*a13 - a03*a11;
    float b05 = a02*a13 - a03*a12;
    float b06 = a20*a31 - a21*a30;
    float b07 = a20*a32 - a22*a30;
    float b08 = a20*a33 - a23*a30;
    float b09 = a21*a32 - a22*a31;
    float b10 = a21*a33 - a23*a31;
    float b11 = a22*a33 - a23*a32;

    // Calculate the invert determinant (inlined to avoid double-caching)
    float invDet = 1.0f/(b00*b11 - b01*b10 + b02*b09 + b03*b08 - b04*b07 + b05*b06);

    Matrix matViewProjInv = {
        (a11*b11 - a12*b10 + a13*b09)*invDet,
        (-a01*b11 + a02*b10 - a03*b09)*invDet,
        (a31*b05 - a32*b04 + a33*b03)*invDet,
        (-a21*b05 + a22*b04 - a23*b03)*invDet,
        (-a10*b11 + a12*b08 - a13*b07)*invDet,
        (a00*b11 - a02*b08 + a03*b07)*invDet,
        (-a30*b05 + a32*b02 - a33*b01)*invDet,
        (a20*b05 - a22*b02 + a23*b01)*invDet,
        (a10*b10 - a11*b08 + a13*b06)*invDet,
        (-a00*b10 + a01*b08 - a03*b06)*invDet,
        (a30*b04 - a31*b02 + a33*b00)*invDet,
        (-a20*b04 + a21*b02 - a23*b00)*invDet,
        (-a10*b09 + a11*b07 - a12*b06)*invDet,
        (a00*b09 - a01*b07 + a02*b06)*invDet,
        (-a30*b03 + a31*b01 - a32*b00)*invDet,
        (a20*b03 - a21*b01 + a22*b00)*invDet };

    // Create quaternion from source point
    Quaternion quat = { source.x, source.y, source.z, 1.0f };

    // Multiply quat point by unprojecte matrix
    Quaternion qtransformed = {     // QuaternionTransform(quat, matViewProjInv)
        matViewProjInv.m0*quat.x + matViewProjInv.m4*quat.y + matViewProjInv.m8*quat.z + matViewProjInv.m12*quat.w,
        matViewProjInv.m1*quat.x + matViewProjInv.m5*quat.y + matViewProjInv.m9*quat.z + matViewProjInv.m13*quat.w,
        matViewProjInv.m2*quat.x + matViewProjInv.m6*quat.y + matViewProjInv.m10*quat.z + matViewProjInv.m14*quat.w,
        matViewProjInv.m3*quat.x + matViewProjInv.m7*quat.y + matViewProjInv.m11*quat.z + matViewProjInv.m15*quat.w };

    // Normalized world points in vectors
    result.x = qtransformed.x/qtransformed.w;
    result.y = qtransformed.y/qtransformed.w;
    result.z = qtransformed.z/qtransformed.w;

    return result;
}